

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string.c
# Opt level: O0

void test_archive_strcpy(void)

{
  archive_string *paVar1;
  undefined1 local_20 [8];
  archive_string s;
  
  local_20 = (undefined1  [8])0x0;
  s.s = (char *)0x0;
  s.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¯',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¯',0,"0",s.length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'¯',(char *)0x0,"((void*)0)",(char *)local_20,"(s).s",(void *)0x0,L'\0');
  s.s = (char *)0x0;
  paVar1 = archive_strncat((archive_string *)local_20,"snafu",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'²',(uint)((archive_string *)local_20 == paVar1),
                   "&s == archive_strcpy(&s, \"snafu\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'³',5,"5",(longlong)s.s,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'³',0x20,"32",s.length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'³',"snafu","\"snafu\"",(char *)local_20,"(s).s",(void *)0x0,L'\0');
  s.s = (char *)0x0;
  paVar1 = archive_strncat((archive_string *)local_20,"foo",3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'¶',(uint)((archive_string *)local_20 == paVar1),
                   "&s == archive_strcpy(&s, \"foo\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'·',3,"3",(longlong)s.s,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'·',0x20,"32",s.length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'·',"foo","\"foo\"",(char *)local_20,"(s).s",(void *)0x0,L'\0');
  s.s = (char *)0x0;
  paVar1 = archive_strncat((archive_string *)local_20,"",0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'º',(uint)((archive_string *)local_20 == paVar1),
                   "&s == archive_strcpy(&s, \"\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'»',0,"0",(longlong)s.s,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'»',0x20,"32",s.length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'»',"","\"\"",(char *)local_20,"(s).s",(void *)0x0,L'\0');
  archive_string_free((archive_string *)local_20);
  return;
}

Assistant:

static void
test_archive_strcpy(void)
{
	struct archive_string s;

	archive_string_init(&s);
	assertExactString(0, 0, NULL, s);

	/* null target */
	assert(&s == archive_strcpy(&s, "snafu"));
	assertExactString(5, EXTENT, "snafu", s);

	/* dirty target */
	assert(&s == archive_strcpy(&s, "foo"));
	assertExactString(3, EXTENT, "foo", s);

	/* dirty target, empty source */
	assert(&s == archive_strcpy(&s, ""));
	assertExactString(0, EXTENT, "", s);

	archive_string_free(&s);
}